

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

void __thiscall ipx::LpSolver::MakeIPMStartingPointValid(LpSolver *this)

{
  Int *pIVar1;
  double dVar2;
  double *pdVar3;
  uint uVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  iVar6 = (this->model_).num_cols_;
  pIVar1 = &(this->model_).num_rows_;
  uVar4 = iVar6 + *pIVar1;
  if (uVar4 != 0 && SCARRY4(iVar6,*pIVar1) == (int)uVar4 < 0) {
    uVar7 = 0;
    iVar6 = 0;
    dVar9 = 0.0;
    do {
      dVar2 = (this->xl_start_)._M_data[uVar7];
      if ((0.0 < dVar2) && (dVar8 = (this->zl_start_)._M_data[uVar7], 0.0 < dVar8)) {
        dVar9 = dVar9 + dVar2 * dVar8;
        iVar6 = iVar6 + 1;
      }
      dVar2 = (this->xu_start_)._M_data[uVar7];
      if ((0.0 < dVar2) && (dVar8 = (this->zu_start_)._M_data[uVar7], 0.0 < dVar8)) {
        dVar9 = dVar9 + dVar2 * dVar8;
        iVar6 = iVar6 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    if (iVar6 != 0) {
      dVar9 = dVar9 / (double)iVar6;
      goto LAB_003a1868;
    }
  }
  dVar9 = 1.0;
LAB_003a1868:
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      if ((ulong)ABS((this->model_).lb_._M_data[uVar7]) < 0x7ff0000000000000) {
        pdVar5 = (this->xl_start_)._M_data;
        pdVar3 = (this->zl_start_)._M_data;
        dVar2 = pdVar5[uVar7];
        dVar8 = pdVar3[uVar7];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            pdVar3[uVar7] = dVar9 / dVar2;
          }
        }
        else {
          if ((dVar8 != 0.0) || (NAN(dVar8))) {
            dVar8 = dVar9 / dVar8;
          }
          else {
            dVar8 = SQRT(dVar9);
            if (dVar9 < 0.0) {
              dVar8 = sqrt(dVar9);
            }
            (this->zl_start_)._M_data[uVar7] = dVar8;
            pdVar5 = (this->xl_start_)._M_data;
          }
          pdVar5[uVar7] = dVar8;
        }
      }
      if ((ulong)ABS((this->model_).ub_._M_data[uVar7]) < 0x7ff0000000000000) {
        pdVar5 = (this->xu_start_)._M_data;
        pdVar3 = (this->zu_start_)._M_data;
        dVar2 = pdVar5[uVar7];
        dVar8 = pdVar3[uVar7];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            pdVar3[uVar7] = dVar9 / dVar2;
          }
        }
        else {
          if ((dVar8 != 0.0) || (NAN(dVar8))) {
            dVar8 = dVar9 / dVar8;
          }
          else {
            dVar8 = SQRT(dVar9);
            if (dVar9 < 0.0) {
              dVar8 = sqrt(dVar9);
            }
            (this->zu_start_)._M_data[uVar7] = dVar8;
            pdVar5 = (this->xu_start_)._M_data;
          }
          pdVar5[uVar7] = dVar8;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  return;
}

Assistant:

void LpSolver::MakeIPMStartingPointValid() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    Vector& xl = xl_start_;
    Vector& xu = xu_start_;
    Vector& zl = zl_start_;
    Vector& zu = zu_start_;

    Int numComplementarityProducts = 0;
    double sumComplementarityProducts = 0.0;
    for (Int j = 0; j < n+m; ++j) {
        if (xl[j] > 0.0 && zl[j] > 0.0) {
            sumComplementarityProducts += xl[j] * zl[j];
            numComplementarityProducts++;
        }
        if (xu[j] > 0.0 && zu[j] > 0.0) {
            sumComplementarityProducts += xu[j] * zu[j];
            numComplementarityProducts++;
        }
    }
    const double mu = numComplementarityProducts ?
        sumComplementarityProducts / numComplementarityProducts : 1.0;

    for (Int j = 0; j < n+m; ++j) {
        if (std::isfinite(lb[j])) {
            assert(std::isfinite(xl[j]) && xl[j] >= 0.0);
            assert(std::isfinite(zl[j]) && zl[j] >= 0.0);
            if (xl[j] == 0.0 && zl[j] == 0.0)
                xl[j] = zl[j] = std::sqrt(mu);
            else if (xl[j] == 0.0)
                xl[j] = mu / zl[j];
            else if (zl[j] == 0.0)
                zl[j] = mu / xl[j];
        } else {
            assert(xl[j] == INFINITY);
            assert(zl[j] == 0.0);
        }
        if (std::isfinite(ub[j])) {
            assert(std::isfinite(xu[j]) && xu[j] >= 0.0);
            assert(std::isfinite(zu[j]) && zu[j] >= 0.0);
            if (xu[j] == 0.0 && zu[j] == 0.0)
                xu[j] = zu[j] = std::sqrt(mu);
            else if (xu[j] == 0.0)
                xu[j] = mu / zu[j];
            else if (zu[j] == 0.0)
                zu[j] = mu / xu[j];
        } else {
            assert(xu[j] == INFINITY);
            assert(zu[j] == 0.0);
        }
    }
}